

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int expansion_sum_zeroelim1(int elen,double *e,int flen,double *f,double *h)

{
  double dVar1;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double hnow;
  int hlast;
  int hindex;
  int findex;
  int index;
  double Qnew;
  double Q;
  double *h_local;
  double *f_local;
  int flen_local;
  double *e_local;
  int elen_local;
  
  Qnew = *f;
  for (hnow._4_4_ = 0; hnow._4_4_ < elen; hnow._4_4_ = hnow._4_4_ + 1) {
    dVar1 = Qnew + e[hnow._4_4_];
    h[hnow._4_4_] = (Qnew - (dVar1 - (dVar1 - Qnew))) + (e[hnow._4_4_] - (dVar1 - Qnew));
    Qnew = dVar1;
  }
  h[hnow._4_4_] = Qnew;
  hnow._0_4_ = hnow._4_4_;
  for (hlast = 1; hlast < flen; hlast = hlast + 1) {
    Qnew = f[hlast];
    for (hnow._4_4_ = hlast; hnow._4_4_ <= hnow._0_4_; hnow._4_4_ = hnow._4_4_ + 1) {
      dVar1 = Qnew + h[hnow._4_4_];
      h[hnow._4_4_] = (Qnew - (dVar1 - (dVar1 - Qnew))) + (h[hnow._4_4_] - (dVar1 - Qnew));
      Qnew = dVar1;
    }
    hnow._0_4_ = hnow._0_4_ + 1;
    h[hnow._0_4_] = Qnew;
  }
  hnow._4_4_ = -1;
  for (hindex = 0; hindex <= hnow._0_4_; hindex = hindex + 1) {
    dVar1 = h[hindex];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      hnow._4_4_ = hnow._4_4_ + 1;
      h[hnow._4_4_] = dVar1;
    }
  }
  if (hnow._4_4_ == -1) {
    e_local._4_4_ = 1;
  }
  else {
    e_local._4_4_ = hnow._4_4_ + 1;
  }
  return e_local._4_4_;
}

Assistant:

int expansion_sum_zeroelim1(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* e and h can be the same, but f and h cannot. */
{
  REAL Q;
  INEXACT REAL Qnew;
  int index, findex, hindex, hlast;
  REAL hnow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  Q = f[0];
  for (hindex = 0; hindex < elen; hindex++) {
    hnow = e[hindex];
    Two_Sum(Q, hnow, Qnew, h[hindex]);
    Q = Qnew;
  }
  h[hindex] = Q;
  hlast = hindex;
  for (findex = 1; findex < flen; findex++) {
    Q = f[findex];
    for (hindex = findex; hindex <= hlast; hindex++) {
      hnow = h[hindex];
      Two_Sum(Q, hnow, Qnew, h[hindex]);
      Q = Qnew;
    }
    h[++hlast] = Q;
  }
  hindex = -1;
  for (index = 0; index <= hlast; index++) {
    hnow = h[index];
    if (hnow != 0.0) {
      h[++hindex] = hnow;
    }
  }
  if (hindex == -1) {
    return 1;
  } else {
    return hindex + 1;
  }
}